

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong in_RSI;
  undefined8 *in_RDI;
  bool bVar4;
  int64_t targetpos;
  int error;
  int notEOF;
  mcpl_fileinternal_t *f;
  int64_t in_stack_ffffffffffffffc8;
  
  if ((in_RSI < (ulong)in_RDI[8]) && ((ulong)in_RDI[0x11] < (ulong)in_RDI[8])) {
    in_RDI[0x11] = in_RSI + in_RDI[0x11];
  }
  else {
    in_RDI[0x11] = in_RDI[8];
  }
  if ((ulong)in_RDI[8] < (ulong)in_RDI[0x11]) {
    in_RDI[0x11] = in_RDI[8];
  }
  uVar1 = in_RDI[0x11];
  uVar2 = in_RDI[8];
  if ((in_RSI != 0) && (uVar1 < uVar2 != 0)) {
    if (in_RDI[1] == 0) {
      iVar3 = fseek((FILE *)*in_RDI,*(uint *)(in_RDI + 0xf) * in_RSI,1);
      bVar4 = iVar3 != 0;
    }
    else {
      iVar3 = mcpl_gzseek((gzFile)(in_RDI[0x11] * (ulong)*(uint *)(in_RDI + 0xf) + in_RDI[0x10]),
                          in_stack_ffffffffffffffc8);
      bVar4 = iVar3 == 0;
    }
    if (bVar4) {
      mcpl_error((char *)0x1050da);
    }
  }
  return (uint)(uVar1 < uVar2);
}

Assistant:

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)
{
  MCPLIMP_FILEDECODE;
  //increment, but guard against overflows:
  if ( n >= f->nparticles || f->current_particle_idx >= f->nparticles )
    f->current_particle_idx = f->nparticles;
  else
    f->current_particle_idx += n;
  if ( f->current_particle_idx > f->nparticles )
    f->current_particle_idx = f->nparticles;

  int notEOF = f->current_particle_idx<f->nparticles;
  if (n==0)
    return notEOF;
  if (notEOF) {
    int error;
    if (f->filegz) {
      int64_t targetpos = f->current_particle_idx*f->particle_size+f->first_particle_pos;
      error = ! mcpl_gzseek(f->filegz, targetpos );
    } else {
      error = MCPL_FSEEK_CUR( f->file, f->particle_size * n )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while skipping in particle list");
  }
  return notEOF;
}